

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O1

cbtScalar FindMaxSeparation(int *edgeIndex,cbtBox2dShape *poly1,cbtTransform *xf1,
                           cbtBox2dShape *poly2,cbtTransform *xf2)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  cbtScalar *pcVar14;
  ulong uVar15;
  int edge1;
  int edge1_00;
  ulong uVar16;
  int edge1_01;
  undefined1 auVar17 [16];
  undefined1 extraout_var [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  cVar1 = (poly2->m_centroid).m_floats[0];
  fVar2 = (poly2->m_centroid).m_floats[1];
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (xf2->m_basis).m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)(xf2->m_basis).m_el[0].m_floats[0]));
  cVar3 = (poly2->m_centroid).m_floats[2];
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(xf2->m_basis).m_el[0].m_floats[2]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (xf2->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)(xf2->m_basis).m_el[1].m_floats[0]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(xf2->m_basis).m_el[1].m_floats[2]));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (xf2->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)(xf2->m_basis).m_el[2].m_floats[0]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(xf2->m_basis).m_el[2].m_floats[2]));
  cVar1 = (poly1->m_centroid).m_floats[0];
  fVar2 = (poly1->m_centroid).m_floats[1];
  fVar4 = (xf1->m_basis).m_el[0].m_floats[1];
  auVar25 = ZEXT416((uint)(xf1->m_basis).m_el[0].m_floats[0]);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),ZEXT416((uint)cVar1),auVar25);
  cVar3 = (poly1->m_centroid).m_floats[2];
  auVar26 = ZEXT416((uint)(xf1->m_basis).m_el[0].m_floats[2]);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)cVar3),auVar26);
  fVar5 = (xf1->m_basis).m_el[1].m_floats[0];
  fVar6 = (xf1->m_basis).m_el[1].m_floats[1];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar2)),ZEXT416((uint)cVar1),ZEXT416((uint)fVar5)
                           );
  fVar7 = (xf1->m_basis).m_el[1].m_floats[2];
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar3),ZEXT416((uint)fVar7));
  fVar8 = (xf1->m_basis).m_el[2].m_floats[1];
  auVar27 = ZEXT416((uint)(xf1->m_basis).m_el[2].m_floats[0]);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar2)),auVar27,ZEXT416((uint)cVar1));
  auVar23 = ZEXT416((uint)(xf1->m_basis).m_el[2].m_floats[2]);
  auVar13 = vfmadd231ss_fma(auVar13,auVar23,ZEXT416((uint)cVar3));
  fVar2 = (auVar22._0_4_ + (xf2->m_origin).m_floats[0]) -
          (auVar11._0_4_ + (xf1->m_origin).m_floats[0]);
  fVar9 = (auVar17._0_4_ + (xf2->m_origin).m_floats[1]) -
          (auVar12._0_4_ + (xf1->m_origin).m_floats[1]);
  fVar10 = (auVar18._0_4_ + (xf2->m_origin).m_floats[2]) -
           (auVar13._0_4_ + (xf1->m_origin).m_floats[2]);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar9)),ZEXT416((uint)fVar2),auVar25);
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar10),auVar27);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar9)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar4)
                           );
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar10),ZEXT416((uint)fVar8));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar9)),auVar26,ZEXT416((uint)fVar2));
  auVar18 = vfmadd231ss_fma(auVar18,auVar23,ZEXT416((uint)fVar10));
  pcVar14 = poly1->m_normals[0].m_floats + 2;
  uVar16 = 0xffffffff;
  auVar24 = ZEXT464(0xff7fffff);
  uVar15 = 0;
  do {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * pcVar14[-1])),auVar22,
                              ZEXT416((uint)((cbtVector3 *)(pcVar14 + -2))->m_floats[0]));
    auVar11 = vfmadd231ss_fma(auVar11,auVar18,ZEXT416((uint)*pcVar14));
    if (auVar24._0_4_ < auVar11._0_4_) {
      uVar16 = uVar15 & 0xffffffff;
    }
    edge1_00 = (int)uVar16;
    auVar11 = vmaxss_avx(auVar11,auVar24._0_16_);
    auVar24 = ZEXT1664(auVar11);
    uVar15 = uVar15 + 1;
    pcVar14 = pcVar14 + 4;
  } while (uVar15 != 4);
  auVar24._0_4_ = EdgeSeparation(poly1,xf1,edge1_00,poly2,xf2);
  auVar24._4_60_ = extraout_var;
  auVar17 = auVar24._0_16_;
  auVar22 = auVar17;
  if (auVar24._0_4_ <= 0.0) {
    edge1_01 = 3;
    if (0 < edge1_00) {
      edge1_01 = edge1_00 + -1;
    }
    auVar19._0_4_ = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
    auVar19._4_60_ = extraout_var_00;
    auVar18 = auVar19._0_16_;
    auVar22 = auVar18;
    if (auVar19._0_4_ <= 0.0) {
      edge1 = 0;
      if (edge1_00 < 3) {
        edge1 = edge1_00 + 1;
      }
      auVar20._0_4_ = EdgeSeparation(poly1,xf1,edge1,poly2,xf2);
      auVar20._4_60_ = extraout_var_01;
      auVar22 = auVar20._0_16_;
      if (auVar20._0_4_ <= 0.0) {
        uVar15 = vcmpps_avx512vl(auVar17,auVar18,1);
        uVar16 = vcmpps_avx512vl(auVar22,auVar18,1);
        if (((uVar15 & uVar16 & 1) != 0) ||
           (edge1_01 = edge1, auVar18 = auVar22, auVar24._0_4_ < auVar20._0_4_)) {
          do {
            auVar17 = auVar18;
            edge1_00 = edge1_01;
            if ((uVar15 & uVar16 & 1) == 0) {
              edge1_01 = edge1_00 + 1;
              if (2 < edge1_00) {
                edge1_01 = 0;
              }
            }
            else {
              edge1_01 = edge1_00 + -1;
              if (edge1_00 < 1) {
                edge1_01 = 3;
              }
            }
            auVar21._0_4_ = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
            auVar21._4_60_ = extraout_var_02;
            auVar22 = auVar21._0_16_;
            if (0.0 < auVar21._0_4_) goto LAB_008e7d99;
            auVar18 = auVar21._0_16_;
          } while (auVar17._0_4_ < auVar21._0_4_);
        }
        *edgeIndex = edge1_00;
        auVar22 = auVar17;
      }
    }
  }
LAB_008e7d99:
  return auVar22._0_4_;
}

Assistant:

static cbtScalar FindMaxSeparation(int* edgeIndex,
								  const cbtBox2dShape* poly1, const cbtTransform& xf1,
								  const cbtBox2dShape* poly2, const cbtTransform& xf2)
{
	int count1 = poly1->getVertexCount();
	const cbtVector3* normals1 = poly1->getNormals();

	// Vector pointing from the centroid of poly1 to the centroid of poly2.
	cbtVector3 d = b2Mul(xf2, poly2->getCentroid()) - b2Mul(xf1, poly1->getCentroid());
	cbtVector3 dLocal1 = b2MulT(xf1.getBasis(), d);

	// Find edge normal on poly1 that has the largest projection onto d.
	int edge = 0;
	cbtScalar maxDot;
	if (count1 > 0)
		edge = (int)dLocal1.maxDot(normals1, count1, maxDot);

	// Get the separation for the edge normal.
	cbtScalar s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
	if (s > 0.0f)
	{
		return s;
	}

	// Check the separation for the previous edge normal.
	int prevEdge = edge - 1 >= 0 ? edge - 1 : count1 - 1;
	cbtScalar sPrev = EdgeSeparation(poly1, xf1, prevEdge, poly2, xf2);
	if (sPrev > 0.0f)
	{
		return sPrev;
	}

	// Check the separation for the next edge normal.
	int nextEdge = edge + 1 < count1 ? edge + 1 : 0;
	cbtScalar sNext = EdgeSeparation(poly1, xf1, nextEdge, poly2, xf2);
	if (sNext > 0.0f)
	{
		return sNext;
	}

	// Find the best edge and the search direction.
	int bestEdge;
	cbtScalar bestSeparation;
	int increment;
	if (sPrev > s && sPrev > sNext)
	{
		increment = -1;
		bestEdge = prevEdge;
		bestSeparation = sPrev;
	}
	else if (sNext > s)
	{
		increment = 1;
		bestEdge = nextEdge;
		bestSeparation = sNext;
	}
	else
	{
		*edgeIndex = edge;
		return s;
	}

	// Perform a local search for the best edge normal.
	for (;;)
	{
		if (increment == -1)
			edge = bestEdge - 1 >= 0 ? bestEdge - 1 : count1 - 1;
		else
			edge = bestEdge + 1 < count1 ? bestEdge + 1 : 0;

		s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
		if (s > 0.0f)
		{
			return s;
		}

		if (s > bestSeparation)
		{
			bestEdge = edge;
			bestSeparation = s;
		}
		else
		{
			break;
		}
	}

	*edgeIndex = bestEdge;
	return bestSeparation;
}